

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

int stbi__free_jpeg_components(stbi__jpeg *z,int ncomp,int why)

{
  int local_1c;
  int i;
  int why_local;
  int ncomp_local;
  stbi__jpeg *z_local;
  
  for (local_1c = 0; local_1c < ncomp; local_1c = local_1c + 1) {
    if (z->img_comp[local_1c].raw_data != (void *)0x0) {
      free(z->img_comp[local_1c].raw_data);
      z->img_comp[local_1c].raw_data = (void *)0x0;
      z->img_comp[local_1c].data = (stbi_uc *)0x0;
    }
    if (z->img_comp[local_1c].raw_coeff != (void *)0x0) {
      free(z->img_comp[local_1c].raw_coeff);
      z->img_comp[local_1c].raw_coeff = (void *)0x0;
      z->img_comp[local_1c].coeff = (short *)0x0;
    }
    if (z->img_comp[local_1c].linebuf != (stbi_uc *)0x0) {
      free(z->img_comp[local_1c].linebuf);
      z->img_comp[local_1c].linebuf = (stbi_uc *)0x0;
    }
  }
  return why;
}

Assistant:

static int stbi__free_jpeg_components(stbi__jpeg *z, int ncomp, int why)
{
   int i;
   for (i=0; i < ncomp; ++i) {
      if (z->img_comp[i].raw_data) {
         STBI_FREE(z->img_comp[i].raw_data);
         z->img_comp[i].raw_data = NULL;
         z->img_comp[i].data = NULL;
      }
      if (z->img_comp[i].raw_coeff) {
         STBI_FREE(z->img_comp[i].raw_coeff);
         z->img_comp[i].raw_coeff = 0;
         z->img_comp[i].coeff = 0;
      }
      if (z->img_comp[i].linebuf) {
         STBI_FREE(z->img_comp[i].linebuf);
         z->img_comp[i].linebuf = NULL;
      }
   }
   return why;
}